

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

PClassActor * P_GetSpawnableType(int spawnnum)

{
  PClassActor **ppPVar1;
  PClassActor *pPVar2;
  FName local_4;
  
  if (spawnnum < 0) {
    if ((uint)-spawnnum < (uint)FName::NameData.NumNames) {
      pPVar2 = PClass::FindActor(&local_4);
      return pPVar2;
    }
  }
  else {
    ppPVar1 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CheckKey
                        (&SpawnableThings,spawnnum);
    if (ppPVar1 != (PClassActor **)0x0) {
      return *ppPVar1;
    }
  }
  return (PClassActor *)0x0;
}

Assistant:

PClassActor *P_GetSpawnableType(int spawnnum)
{
	if (spawnnum < 0)
	{ // A named arg from a UDMF map
		FName spawnname = FName(ENamedName(-spawnnum));
		if (spawnname.IsValidName())
		{
			return PClass::FindActor(spawnname);
		}
	}
	else
	{ // A numbered arg from a Hexen or UDMF map
		PClassActor **type = SpawnableThings.CheckKey(spawnnum);
		if (type != NULL)
		{
			return *type;
		}
	}
	return NULL;
}